

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O0

bool __thiscall
burst::
subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
::equal(subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
        *this,subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
              *that)

{
  bool bVar1;
  const_iterator __first1;
  __normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
  __last1;
  const_iterator __first2;
  __normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
  __last2;
  subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
  *that_local;
  subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
  *this_local;
  
  bVar1 = std::operator==(&this->m_begin,&that->m_begin);
  if (!bVar1) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                  ,0x83,
                  "bool burst::subsequence_iterator<std::_List_const_iterator<int>>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = std::_List_const_iterator<int>, SubsequenceContainer = std::vector<std::_List_const_iterator<int>>]"
                 );
  }
  bVar1 = std::operator==(&this->m_end,&that->m_end);
  if (!bVar1) {
    __assert_fail("this->m_end == that.m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                  ,0x84,
                  "bool burst::subsequence_iterator<std::_List_const_iterator<int>>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = std::_List_const_iterator<int>, SubsequenceContainer = std::vector<std::_List_const_iterator<int>>]"
                 );
  }
  __first1 = subsequence_begin(this);
  __last1 = subsequence_end(this);
  __first2 = subsequence_begin(that);
  __last2 = subsequence_end(that);
  bVar1 = std::
          equal<__gnu_cxx::__normal_iterator<std::_List_const_iterator<int>const*,std::vector<std::_List_const_iterator<int>,std::allocator<std::_List_const_iterator<int>>>>,__gnu_cxx::__normal_iterator<std::_List_const_iterator<int>const*,std::vector<std::_List_const_iterator<int>,std::allocator<std::_List_const_iterator<int>>>>>
                    ((__normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
                      )__first1._M_current,__last1,
                     (__normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
                      )__first2._M_current,__last2);
  return bVar1;
}

Assistant:

bool equal (const subsequence_iterator & that) const
        {
            BOOST_ASSERT(this->m_begin == that.m_begin);
            BOOST_ASSERT(this->m_end == that.m_end);
            return
                std::equal
                (
                    this->subsequence_begin(), this->subsequence_end(),
                    that.subsequence_begin(), that.subsequence_end()
                );
        }